

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest08CertificatePolicies_::
Section8OverlappingPoliciesTest6Subpart1<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section8OverlappingPoliciesTest6Subpart1
          (Section8OverlappingPoliciesTest6Subpart1<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest08CertificatePolicies,
                     Section8OverlappingPoliciesTest6Subpart1) {
  const char* const certs[] = {
      "TrustAnchorRootCertificate", "PoliciesP1234CACert",
      "PoliciesP1234subCAP123Cert", "PoliciesP1234subsubCAP123P12Cert",
      "OverlappingPoliciesTest6EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "PoliciesP1234CACRL",
                              "PoliciesP1234subCAP123CRL",
                              "PoliciesP1234subsubCAP123P12CRL"};
  PkitsTestInfo info;
  info.test_number = "4.8.6";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}